

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O2

int os_setlocale(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = luaL_optlstring(L,1,(char *)0x0,(size_t *)0x0);
  iVar1 = luaL_checkoption(L,2,"all",os_setlocale::catnames);
  pcVar2 = setlocale(os_setlocale::cat[iVar1],pcVar2);
  lua_pushstring(L,pcVar2);
  return 1;
}

Assistant:

static int os_setlocale(lua_State *L) {
    static const int cat[] = {LC_ALL, LC_COLLATE, LC_CTYPE, LC_MONETARY,
                              LC_NUMERIC, LC_TIME};
    static const char *const catnames[] = {"all", "collate", "ctype", "monetary",
                                           "numeric", "time", NULL};
    const char *l = luaL_optstring(L, 1, NULL);
    int op = luaL_checkoption(L, 2, "all", catnames);
    lua_pushstring(L, setlocale(cat[op], l));
    return 1;
}